

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.cpp
# Opt level: O2

int apply_chat_template_with_error_handling
              (common_chat_templates *tmpls,LlamaData *llama_data,bool append,int *output_length,
              bool use_jinja)

{
  pointer plVar1;
  int iVar2;
  pointer plVar3;
  common_chat_params chat_params;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string result;
  common_chat_templates_inputs inputs;
  
  inputs.grammar._M_dataplus._M_p = (pointer)&inputs.grammar.field_2;
  inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inputs.messages.super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  inputs.grammar._M_string_length = 0;
  inputs.grammar.field_2._M_local_buf[0] = '\0';
  inputs.json_schema._M_dataplus._M_p = (pointer)&inputs.json_schema.field_2;
  inputs.json_schema._M_string_length = 0;
  inputs.json_schema.field_2._M_local_buf[0] = '\0';
  inputs.add_generation_prompt = true;
  inputs.use_jinja = true;
  inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._0_5_ = 0;
  inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_finish._5_3_ = 0;
  inputs.tools.super__Vector_base<common_chat_tool,_std::allocator<common_chat_tool>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
  inputs._117_8_ = 0;
  inputs.extract_reasoning = true;
  plVar1 = (llama_data->messages).
           super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (plVar3 = (llama_data->messages).
                super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
                super__Vector_impl_data._M_start; plVar3 != plVar1; plVar3 = plVar3 + 1) {
    chat_params.prompt._M_dataplus._M_p = (pointer)0x0;
    chat_params.prompt._M_string_length._0_1_ = 0;
    chat_params.prompt.field_2._8_8_ = &chat_params.grammar._M_string_length;
    chat_params.grammar._M_dataplus._M_p = (pointer)0x0;
    chat_params.grammar._M_string_length._0_1_ = 0;
    chat_params.grammar_triggers.
    super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    chat_params.preserved_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    chat_params.grammar_triggers.
    super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    chat_params.grammar_triggers.
    super__Vector_base<common_grammar_trigger,_std::allocator<common_grammar_trigger>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    chat_params.grammar.field_2._8_8_ = 0;
    chat_params.grammar_lazy = false;
    chat_params._73_7_ = 0;
    chat_params.preserved_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)&chat_params.additional_stops;
    chat_params.preserved_tokens.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    chat_params.additional_stops.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
    chat_params.additional_stops.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_108;
    local_108._M_local_buf[0] = '\0';
    local_f8._M_p = (pointer)&local_e8;
    local_f0 = 0;
    local_e8._M_local_buf[0] = '\0';
    chat_params._0_8_ = &chat_params.prompt._M_string_length;
    std::__cxx11::string::assign((char *)&chat_params);
    std::__cxx11::string::assign(chat_params.prompt.field_2._M_local_buf + 8);
    std::vector<common_chat_msg,_std::allocator<common_chat_msg>_>::push_back
              (&inputs.messages,(common_chat_msg *)&chat_params);
    common_chat_msg::~common_chat_msg((common_chat_msg *)&chat_params);
  }
  inputs.use_jinja = use_jinja;
  inputs.add_generation_prompt = append;
  common_chat_templates_apply(&chat_params,tmpls,&inputs);
  std::__cxx11::string::string((string *)&result,(string *)&chat_params.prompt);
  std::vector<char,_std::allocator<char>_>::resize
            (&llama_data->fmtted,
             CONCAT44(result._M_string_length._4_4_,(int)result._M_string_length) + 1);
  memcpy((llama_data->fmtted).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_start,result._M_dataplus._M_p,
         CONCAT44(result._M_string_length._4_4_,(int)result._M_string_length) + 1);
  std::__cxx11::string::~string((string *)&result);
  common_chat_params::~common_chat_params(&chat_params);
  common_chat_templates_inputs::~common_chat_templates_inputs(&inputs);
  if ((int)result._M_string_length < 0) {
    printe("failed to apply the chat template\n");
    iVar2 = -1;
  }
  else {
    *output_length = (int)result._M_string_length;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int apply_chat_template_with_error_handling(const common_chat_templates * tmpls, LlamaData & llama_data, const bool append, int & output_length, bool use_jinja) {
    const int new_len = apply_chat_template(tmpls, llama_data, append, use_jinja);
    if (new_len < 0) {
        printe("failed to apply the chat template\n");
        return -1;
    }

    output_length = new_len;
    return 0;
}